

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O2

RC __thiscall QL_NodeSel::GetNext(QL_NodeSel *this,char *data)

{
  int iVar1;
  RC RVar2;
  RC rc;
  
  do {
    iVar1 = (*this->prevNode->_vptr_QL_Node[1])(this->prevNode,this->buffer);
    if (iVar1 != 0) {
      return iVar1;
    }
    RVar2 = QL_Node::CheckConditions(&this->super_QL_Node,this->buffer);
  } while (RVar2 != 0);
  memcpy(data,this->buffer,(long)(this->super_QL_Node).tupleLength);
  return 0;
}

Assistant:

RC QL_NodeSel::GetNext(char *data){
  RC rc = 0;
  while(true){
    if((rc = prevNode.GetNext(buffer))){
      return (rc);
    }
    // keep retrieving records until the conditions are met
    RC cond = CheckConditions(buffer);
    if(cond == 0)
      break;
  }
  memcpy(data, buffer, tupleLength);
  return (0);
}